

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O2

Matrix4f *
Matrix4f::infinitePerspectiveProjection
          (Matrix4f *__return_storage_ptr__,float fLeft,float fRight,float fBottom,float fTop,
          float fZNear,bool directX)

{
  undefined3 in_register_00000031;
  float in_XMM0_Db;
  float in_XMM1_Db;
  float in_XMM2_Db;
  float fVar1;
  float in_XMM3_Db;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  Matrix4f(__return_storage_ptr__,0.0);
  __return_storage_ptr__->m_elements[0] = (fZNear + fZNear) / (fRight - fLeft);
  auVar2._0_4_ = fLeft + fRight;
  auVar2._4_4_ = fBottom + fTop;
  auVar2._8_4_ = in_XMM0_Db + in_XMM1_Db;
  auVar2._12_4_ = in_XMM2_Db + in_XMM3_Db;
  auVar3._4_4_ = fTop - fBottom;
  auVar3._0_4_ = fRight - fLeft;
  auVar3._8_4_ = in_XMM1_Db - in_XMM0_Db;
  auVar3._12_4_ = in_XMM3_Db - in_XMM2_Db;
  auVar3 = divps(auVar2,auVar3);
  __return_storage_ptr__->m_elements[5] = (fZNear + fZNear) / (fTop - fBottom);
  *(long *)(__return_storage_ptr__->m_elements + 8) = auVar3._0_8_;
  __return_storage_ptr__->m_elements[10] = -1.0;
  __return_storage_ptr__->m_elements[0xb] = -1.0;
  if (CONCAT31(in_register_00000031,directX) == 0) {
    fVar1 = fZNear * -2.0;
  }
  else {
    fVar1 = -fZNear;
  }
  __return_storage_ptr__->m_elements[0xe] = fVar1;
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::infinitePerspectiveProjection( float fLeft, float fRight,
												 float fBottom, float fTop,
												 float fZNear, bool directX )
{
	Matrix4f projection;

	projection( 0, 0 ) = ( 2.0f * fZNear ) / ( fRight - fLeft );
	projection( 1, 1 ) = ( 2.0f * fZNear ) / ( fTop - fBottom );
	projection( 0, 2 ) = ( fRight + fLeft ) / ( fRight - fLeft );
	projection( 1, 2 ) = ( fTop + fBottom ) / ( fTop - fBottom );
	projection( 3, 2 ) = -1;

	// infinite view frustum
	// just take the limit as far --> inf of the regular frustum
	if( directX )
	{
		projection( 2, 2 ) = -1.0f;
		projection( 2, 3 ) = -fZNear;		
	}
	else
	{
		projection( 2, 2 ) = -1.0f;
		projection( 2, 3 ) = -2.0f * fZNear;
	}

	return projection;
}